

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O1

void __thiscall
llbuild::buildsystem::ExternalCommand::configureInputs
          (ExternalCommand *this,ConfigureContext *param_1,
          vector<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_> *value
          )

{
  vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  *this_00;
  pointer *pppBVar1;
  pointer ppNVar2;
  iterator __position;
  pointer ppNVar3;
  BuildNode *local_30;
  
  this_00 = &(this->super_Command).inputs;
  std::vector<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
  ::reserve(this_00,(long)(value->
                          super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(value->
                          super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 3);
  ppNVar3 = (value->
            super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppNVar2 = (value->
            super__Vector_base<llbuild::buildsystem::Node_*,_std::allocator<llbuild::buildsystem::Node_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppNVar3 != ppNVar2) {
    do {
      local_30 = (BuildNode *)*ppNVar3;
      __position._M_current =
           (this->super_Command).inputs.
           super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_Command).inputs.
          super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>::
        _M_realloc_insert<llbuild::buildsystem::BuildNode*>
                  ((vector<llbuild::buildsystem::BuildNode*,std::allocator<llbuild::buildsystem::BuildNode*>>
                    *)this_00,__position,&local_30);
      }
      else {
        *__position._M_current = local_30;
        pppBVar1 = &(this->super_Command).inputs.
                    super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppBVar1 = *pppBVar1 + 1;
      }
      ppNVar3 = ppNVar3 + 1;
    } while (ppNVar3 != ppNVar2);
  }
  return;
}

Assistant:

void ExternalCommand::
configureInputs(const ConfigureContext&,
                const std::vector<Node*>& value) {
  inputs.reserve(value.size());
  for (auto* node: value) {
    inputs.emplace_back(static_cast<BuildNode*>(node));
  }
}